

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZmqContextManager.cpp
# Opt level: O2

void __thiscall ZmqContextManager::ZmqContextManager(ZmqContextManager *this,string *contextName)

{
  int local_14;
  
  std::__cxx11::string::string
            ((string *)this,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)contextName);
  std::make_unique<zmq::context_t,int,int>((int *)&this->zcontext,&local_14);
  (this->leakOnDelete)._M_base._M_i = true;
  return;
}

Assistant:

ZmqContextManager::ZmqContextManager(const std::string& contextName):
    name(contextName), zcontext(std::make_unique<zmq::context_t>(1, 4096))
{
}